

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_object.cpp
# Opt level: O3

void init_graphical_object(void)

{
  unsigned_short uVar1;
  Am_Object *pAVar2;
  Am_Constraint *pAVar3;
  Am_Object_Advanced temp;
  Am_Demon_Set demons;
  Am_Object local_20;
  Am_Demon_Set local_18;
  Am_Demon_Set local_10;
  
  Am_Object::Create(&local_20,(char *)&Am_Root_Object);
  pAVar2 = Am_Object::Add(&local_20,100,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x65,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x66,10,0);
  pAVar2 = Am_Object::Add(pAVar2,0x67,10,0);
  pAVar2 = Am_Object::Add(pAVar2,0x69,true,0);
  pAVar2 = Am_Object::Add(pAVar2,0x85,-1,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&compute_depth);
  pAVar2 = Am_Object::Add(pAVar2,0x86,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&pass_window);
  pAVar2 = Am_Object::Add(pAVar2,0x68,pAVar3,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7d8,0,0);
  pAVar2 = Am_Object::Add(pAVar2,2000,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7d1,generic_mask.from_wrapper,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7d7,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7d9,generic_point_in_obj.from_wrapper,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7da,generic_point_in_part.from_wrapper,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7db,generic_point_in_leaf.from_wrapper,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7dc,generic_translate_coordinates.from_wrapper,0);
  pAVar2 = Am_Object::Add(pAVar2,0xdb,false,0);
  Am_Object::operator=(&Am_Graphical_Object,pAVar2);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_20,&Am_Graphical_Object);
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_18);
  Am_Demon_Set::Copy(&local_10);
  Am_Demon_Set::~Am_Demon_Set(&local_18);
  Am_Demon_Set::Set_Object_Demon(&local_10,Am_CREATE_OBJ,graphics_create);
  Am_Demon_Set::Set_Object_Demon(&local_10,Am_COPY_OBJ,graphics_create);
  Am_Demon_Set::Set_Object_Demon(&local_10,Am_DESTROY_OBJ,graphics_destroy);
  Am_Demon_Set::Set_Part_Demon(&local_10,Am_CHANGE_OWNER,graphics_change_owner);
  Am_Demon_Set::Set_Slot_Demon(&local_10,4,graphics_repaint,5);
  Am_Demon_Set::Set_Slot_Demon(&local_10,8,graphics_move,5);
  Am_Demon_Set::Set_Type_Check(&local_10,1,Am_Check_Int_Type);
  uVar1 = Am_Object_Advanced::Get_Demon_Mask((Am_Object_Advanced *)&local_20);
  Am_Object_Advanced::Set_Demon_Mask((Am_Object_Advanced *)&local_20,uVar1 | 0xc);
  Am_Object_Advanced::Set_Demons((Am_Object_Advanced *)&local_20,&local_10);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,100);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_18,9);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,100);
  Am_Slot::Set_Type_Check((Am_Slot *)&local_18,1);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,0x65);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_18,9);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,0x65);
  Am_Slot::Set_Type_Check((Am_Slot *)&local_18,1);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,0x66);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_18,9);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,0x67);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_18,9);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,0x69);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_18,9);
  local_18.data =
       (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_20,0x7d8);
  Am_Slot::Set_Inherit_Rule((Am_Slot *)&local_18,Am_LOCAL);
  Am_Demon_Set::~Am_Demon_Set(&local_10);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
init_graphical_object()
{
  Am_Graphical_Object =
      Am_Root_Object.Create(DSTR("Am_Graphical_Object"))
          .Add(Am_LEFT, 0)
          .Add(Am_TOP, 0)
          .Add(Am_WIDTH, 10)
          .Add(Am_HEIGHT, 10)
          .Add(Am_VISIBLE, true)
          .Add(Am_RANK, -1)
          .Add(Am_OWNER_DEPTH, compute_depth)
          .Add(Am_WINDOW, pass_window)
          .Add(Am_PREV_STATE, (0L))
          .Add(Am_DRAW_METHOD, (0L))
          .Add(Am_MASK_METHOD, generic_mask)
          .Add(Am_INVALID_METHOD, (0L))
          .Add(Am_POINT_IN_OBJ_METHOD, generic_point_in_obj)
          .Add(Am_POINT_IN_PART_METHOD, generic_point_in_part)
          .Add(Am_POINT_IN_LEAF_METHOD, generic_point_in_leaf)
          .Add(Am_TRANSLATE_COORDINATES_METHOD, generic_translate_coordinates)
          .Add(Am_AS_LINE, false) //most objects are not like lines
      ;
  Am_Object_Advanced temp = (Am_Object_Advanced &)Am_Graphical_Object;
  Am_Demon_Set demons = temp.Get_Demons().Copy();
  demons.Set_Object_Demon(Am_CREATE_OBJ, graphics_create);
  demons.Set_Object_Demon(Am_COPY_OBJ, graphics_create);
  demons.Set_Object_Demon(Am_DESTROY_OBJ, graphics_destroy);
  demons.Set_Part_Demon(Am_CHANGE_OWNER, graphics_change_owner);
  demons.Set_Slot_Demon(Am_STATIONARY_REDRAW, graphics_repaint,
                        Am_DEMON_PER_OBJECT | Am_DEMON_ON_CHANGE);
  demons.Set_Slot_Demon(Am_MOVING_REDRAW, graphics_move,
                        Am_DEMON_PER_OBJECT | Am_DEMON_ON_CHANGE);
  demons.Set_Type_Check(1, Am_Check_Int_Type);
  unsigned short demon_mask = temp.Get_Demon_Mask();
  demon_mask |= Am_STATIONARY_REDRAW | Am_MOVING_REDRAW;
  temp.Set_Demon_Mask(demon_mask);
  temp.Set_Demons(demons);
  temp.Get_Slot(Am_LEFT).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_LEFT).Set_Type_Check(1);
  temp.Get_Slot(Am_TOP).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_TOP).Set_Type_Check(1);
  temp.Get_Slot(Am_WIDTH).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_HEIGHT).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_VISIBLE).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_PREV_STATE).Set_Inherit_Rule(Am_LOCAL);
#ifdef DEBUG
  Am_Graphical_Object.Add(Am_OBJECT_IN_PROGRESS, 0)
      .Set_Inherit_Rule(Am_OBJECT_IN_PROGRESS, Am_LOCAL);
#endif
}